

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_req_make(httpreq **preq,char *method,size_t m_len,char *scheme,size_t s_len,
                           char *authority,size_t a_len,char *path,size_t p_len)

{
  httpreq *req;
  char *pcVar1;
  CURLcode CVar2;
  
  if (m_len - 0x18 < 0xffffffffffffffe7) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  req = (httpreq *)(*Curl_ccalloc)(1,0xa0);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (req != (httpreq *)0x0) {
    memcpy(req,method,m_len);
    if (scheme == (char *)0x0) {
LAB_00136703:
      if (authority != (char *)0x0) {
        pcVar1 = (char *)Curl_memdup0(authority,a_len);
        req->authority = pcVar1;
        if (pcVar1 == (char *)0x0) goto LAB_00136768;
      }
      if (path != (char *)0x0) {
        pcVar1 = (char *)Curl_memdup0(path,p_len);
        req->path = pcVar1;
        if (pcVar1 == (char *)0x0) goto LAB_00136768;
      }
      CVar2 = CURLE_OK;
      Curl_dynhds_init(&req->headers,0,0x100000);
      Curl_dynhds_init(&req->trailers,0,0x100000);
      goto LAB_00136773;
    }
    pcVar1 = (char *)Curl_memdup0(scheme,s_len);
    req->scheme = pcVar1;
    if (pcVar1 != (char *)0x0) goto LAB_00136703;
LAB_00136768:
    Curl_http_req_free(req);
  }
  req = (httpreq *)0x0;
LAB_00136773:
  *preq = req;
  return CVar2;
}

Assistant:

CURLcode Curl_http_req_make(struct httpreq **preq,
                            const char *method, size_t m_len,
                            const char *scheme, size_t s_len,
                            const char *authority, size_t a_len,
                            const char *path, size_t p_len)
{
  struct httpreq *req;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(method);
  if(m_len + 1 > sizeof(req->method))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  req = calloc(1, sizeof(*req));
  if(!req)
    goto out;
  memcpy(req->method, method, m_len);
  if(scheme) {
    req->scheme = Curl_memdup0(scheme, s_len);
    if(!req->scheme)
      goto out;
  }
  if(authority) {
    req->authority = Curl_memdup0(authority, a_len);
    if(!req->authority)
      goto out;
  }
  if(path) {
    req->path = Curl_memdup0(path, p_len);
    if(!req->path)
      goto out;
  }
  Curl_dynhds_init(&req->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&req->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && req)
    Curl_http_req_free(req);
  *preq = result ? NULL : req;
  return result;
}